

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_module **ppsVar1;
  size_t __n;
  u32 uVar2;
  sqlite3_vtab *psVar3;
  char *pcVar4;
  Fts5IndexIter *pIndexIter;
  u8 *a;
  u32 uVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  u32 nData;
  sqlite3_module *psVar16;
  ulong uVar17;
  int iOff;
  i64 iPos;
  int local_64;
  i64 local_60;
  int local_54;
  uint local_50;
  int local_4c;
  ulong local_48;
  sqlite3_vtab *local_40;
  Fts5Buffer *local_38;
  
  local_40 = pCursor->pVtab;
  local_54 = 0;
  psVar16 = pCursor[2].pVtab[1].pModule;
  uVar15 = *(uint *)&psVar16->xBestIndex;
  pCursor[10].pVtab = (sqlite3_vtab *)((long)&(pCursor[10].pVtab)->pModule + 1);
  uVar17 = (ulong)(int)uVar15;
  local_4c = local_54;
  if (local_40[2].nRef == 0) {
    uVar13 = (ulong)*(int *)&pCursor[7].pVtab;
    uVar14 = *(int *)&pCursor[7].pVtab + 1;
    uVar11 = uVar13;
    if ((int)uVar14 < (int)uVar15) {
      uVar14 = uVar15;
    }
    do {
      uVar12 = uVar14;
      if ((long)uVar17 <= (long)(uVar11 + 1)) break;
      uVar12 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar12;
      lVar7 = uVar11 * 2;
      uVar11 = uVar11 + 1;
    } while (*(long *)(&(pCursor[9].pVtab)->nRef + lVar7) == 0);
    *(uint *)&pCursor[7].pVtab = uVar12;
    if (*(int *)&pCursor[7].pVtab < (int)uVar15) goto LAB_001d9a49;
  }
  else if (local_40[2].nRef == 2) {
    iVar9 = *(int *)((long)&psVar16->xColumn + 4);
    psVar3 = pCursor[4].pVtab;
    do {
      if ((iVar9 != 1) &&
         (iVar8 = sqlite3Fts5PoslistNext64
                            (*(u8 **)&psVar3->nRef,*(int *)&psVar3->zErrMsg,(int *)(pCursor + 0xe),
                             (i64 *)(pCursor + 0xd)), iVar8 == 0)) {
        return 0;
      }
      pCursor[0xd].pVtab = (sqlite3_vtab *)0x0;
      *(undefined4 *)&pCursor[0xe].pVtab = 0;
      iVar8 = sqlite3Fts5IterNextScan((Fts5IndexIter *)pCursor[4].pVtab);
      if (iVar8 == 0) {
        iVar8 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor);
        if (iVar9 == 1) {
          return iVar8;
        }
        if (*(int *)&pCursor[3].pVtab != 0) {
          return iVar8;
        }
      }
      if (iVar8 != 0) {
        *(undefined4 *)&pCursor[3].pVtab = 1;
        return iVar8;
      }
    } while( true );
  }
  psVar3 = pCursor[4].pVtab;
  if (*(char *)((long)&psVar3->zErrMsg + 4) == '\0') {
    pcVar4 = psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 7].zErrMsg;
    nData = *(int *)&psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 8].pModule - 1;
    uVar2 = *(u32 *)&pCursor[5].pVtab;
    local_50 = uVar15;
    if (-1 < (int)uVar2) {
      uVar5 = uVar2;
      if ((int)nData < (int)uVar2) {
        uVar5 = nData;
      }
      iVar9 = memcmp(pCursor[6].pVtab,pcVar4 + 1,(long)(int)uVar5);
      if ((iVar9 < 0) || ((int)uVar2 < (int)nData && iVar9 == 0)) {
        *(undefined4 *)&pCursor[3].pVtab = 1;
        return 0;
      }
    }
    *(undefined4 *)&pCursor[0xc].pVtab = 0;
    local_48 = uVar17;
    sqlite3Fts5BufferAppendBlob(&local_54,(Fts5Buffer *)(pCursor + 0xb),nData,(u8 *)(pcVar4 + 1));
    __n = local_48 * 8;
    memset(pCursor[8].pVtab,0,__n);
    memset(pCursor[9].pVtab,0,__n);
    *(undefined4 *)&pCursor[7].pVtab = 0;
    local_38 = (Fts5Buffer *)(pCursor + 0xb);
    local_4c = local_54;
    uVar15 = local_50;
    uVar14 = local_50;
    uVar17 = local_48;
    do {
      if (local_4c != 0) break;
      iVar9 = *(int *)((long)&(pCursor[2].pVtab[1].pModule)->xColumn + 4);
      local_60 = 0;
      local_64 = 0;
      pIndexIter = (Fts5IndexIter *)pCursor[4].pVtab;
      a = pIndexIter->pData;
      iVar8 = pIndexIter->nData;
      local_50 = uVar14;
      if (local_40[2].nRef == 0) {
        if (iVar9 == 2) {
          while (iVar9 = sqlite3Fts5PoslistNext64(a,iVar8,&local_64,&local_60), iVar9 == 0) {
            if ((long)uVar17 <= local_60) {
              local_4c = 0x10b;
              break;
            }
            ppsVar1 = &(pCursor[9].pVtab)->pModule + local_60;
            *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
          }
        }
        else {
          if (iVar9 != 0) goto LAB_001d9cb4;
          iVar9 = -1;
          do {
            iVar10 = sqlite3Fts5PoslistNext64(a,iVar8,&local_64,&local_60);
            uVar15 = uVar14;
            if (iVar10 != 0) break;
            iVar10 = (int)((ulong)local_60 >> 0x20);
            if (iVar9 == iVar10) {
LAB_001d9c91:
              ppsVar1 = &(pCursor[8].pVtab)->pModule + (local_60 >> 0x20);
              *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
              bVar6 = true;
            }
            else {
              if (iVar10 < (int)uVar14) {
                ppsVar1 = &(pCursor[9].pVtab)->pModule + (local_60 >> 0x20);
                *ppsVar1 = (sqlite3_module *)((long)&(*ppsVar1)->iVersion + 1);
                iVar9 = iVar10;
                goto LAB_001d9c91;
              }
              local_4c = 0x10b;
              bVar6 = false;
            }
          } while (bVar6);
        }
      }
      else if (local_40[2].nRef == 1) {
        if ((iVar9 == 0) &&
           (iVar9 = sqlite3Fts5PoslistNext64(a,iVar8,&local_64,&local_60), iVar9 == 0)) {
          psVar3 = pCursor[8].pVtab;
          psVar16 = psVar3->pModule;
          do {
            psVar16 = (sqlite3_module *)((long)&psVar16->iVersion + 1);
            psVar3->pModule = psVar16;
            iVar9 = sqlite3Fts5PoslistNext64(a,iVar8,&local_64,&local_60);
          } while (iVar9 == 0);
        }
LAB_001d9cb4:
        (pCursor[9].pVtab)->pModule =
             (sqlite3_module *)((long)&(pCursor[9].pVtab)->pModule->iVersion + 1);
        uVar15 = local_50;
      }
      iVar9 = local_4c;
      if (local_4c == 0) {
        iVar9 = sqlite3Fts5IterNextScan(pIndexIter);
      }
      uVar17 = local_48;
      if (local_40[2].nRef == 2) {
        bVar6 = false;
      }
      else {
        if (iVar9 == 0) {
          psVar3 = pCursor[4].pVtab;
          uVar14 = *(int *)&psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 8].pModule - 1;
          if ((uVar14 != *(uint *)&pCursor[0xc].pVtab) ||
             (((1 < *(int *)&psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 8].pModule &&
               (iVar8 = bcmp(psVar3[(ulong)*(ushort *)(psVar3[3].zErrMsg + 4) * 5 + 7].zErrMsg + 1,
                             local_38->p,(ulong)uVar14), iVar8 != 0)) ||
              (*(char *)((long)&psVar3->zErrMsg + 4) != '\0')))) {
            bVar6 = false;
            goto LAB_001d9da1;
          }
        }
        bVar6 = true;
      }
LAB_001d9da1:
      local_4c = iVar9;
      uVar14 = local_50;
    } while (bVar6);
  }
  else {
    *(undefined4 *)&pCursor[3].pVtab = 1;
  }
LAB_001d9a49:
  local_54 = local_4c;
  if (((local_54 == 0) && (*(int *)&pCursor[3].pVtab == 0)) && (local_40[2].nRef == 0)) {
    uVar14 = *(uint *)&pCursor[7].pVtab;
    uVar11 = (ulong)uVar14;
    if ((int)uVar14 < (int)uVar15) {
      uVar11 = (ulong)(int)uVar14;
      do {
        if ((&(pCursor[9].pVtab)->pModule)[uVar11] != (sqlite3_module *)0x0) goto LAB_001d9a8b;
        iVar9 = (int)uVar11;
        uVar11 = uVar11 + 1;
        *(int *)&pCursor[7].pVtab = iVar9 + 1;
      } while (uVar17 != uVar11);
      uVar11 = (ulong)uVar15;
    }
LAB_001d9a8b:
    if ((uint)uVar11 == uVar15) {
      local_54 = 0x10b;
    }
  }
  return local_54;
}

Assistant:

static int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  int rc = SQLITE_OK;
  int nCol = pCsr->pFts5->pConfig->nCol;

  pCsr->rowid++;

  if( pTab->eType==FTS5_VOCAB_INSTANCE ){
    return fts5VocabInstanceNext(pCsr);
  }

  if( pTab->eType==FTS5_VOCAB_COL ){
    for(pCsr->iCol++; pCsr->iCol<nCol; pCsr->iCol++){
      if( pCsr->aDoc[pCsr->iCol] ) break;
    }
  }

  if( pTab->eType!=FTS5_VOCAB_COL || pCsr->iCol>=nCol ){
    if( sqlite3Fts5IterEof(pCsr->pIter) ){
      pCsr->bEof = 1;
    }else{
      const char *zTerm;
      int nTerm;

      zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
      assert( nTerm>=0 );
      if( pCsr->nLeTerm>=0 ){
        int nCmp = MIN(nTerm, pCsr->nLeTerm);
        int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
        if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
          pCsr->bEof = 1;
          return SQLITE_OK;
        }
      }

      sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
      memset(pCsr->aCnt, 0, nCol * sizeof(i64));
      memset(pCsr->aDoc, 0, nCol * sizeof(i64));
      pCsr->iCol = 0;

      assert( pTab->eType==FTS5_VOCAB_COL || pTab->eType==FTS5_VOCAB_ROW );
      while( rc==SQLITE_OK ){
        int eDetail = pCsr->pFts5->pConfig->eDetail;
        const u8 *pPos; int nPos;   /* Position list */
        i64 iPos = 0;               /* 64-bit position read from poslist */
        int iOff = 0;               /* Current offset within position list */

        pPos = pCsr->pIter->pData;
        nPos = pCsr->pIter->nData;

        switch( pTab->eType ){
          case FTS5_VOCAB_ROW:
            if( eDetail==FTS5_DETAIL_FULL ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                pCsr->aCnt[0]++;
              }
            }
            pCsr->aDoc[0]++;
            break;

          case FTS5_VOCAB_COL:
            if( eDetail==FTS5_DETAIL_FULL ){
              int iCol = -1;
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                int ii = FTS5_POS2COLUMN(iPos);
                if( iCol!=ii ){
                  if( ii>=nCol ){
                    rc = FTS5_CORRUPT;
                    break;
                  }
                  pCsr->aDoc[ii]++;
                  iCol = ii;
                }
                pCsr->aCnt[ii]++;
              }
            }else if( eDetail==FTS5_DETAIL_COLUMNS ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff,&iPos) ){
                assert_nc( iPos>=0 && iPos<nCol );
                if( iPos>=nCol ){
                  rc = FTS5_CORRUPT;
                  break;
                }
                pCsr->aDoc[iPos]++;
              }
            }else{
              assert( eDetail==FTS5_DETAIL_NONE );
              pCsr->aDoc[0]++;
            }
            break;

          default:
            assert( pTab->eType==FTS5_VOCAB_INSTANCE );
            break;
        }

        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5IterNextScan(pCsr->pIter);
        }
        if( pTab->eType==FTS5_VOCAB_INSTANCE ) break;

        if( rc==SQLITE_OK ){
          zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
          if( nTerm!=pCsr->term.n 
          || (nTerm>0 && memcmp(zTerm, pCsr->term.p, nTerm)) 
          ){
            break;
          }
          if( sqlite3Fts5IterEof(pCsr->pIter) ) break;
        }
      }
    }
  }

  if( rc==SQLITE_OK && pCsr->bEof==0 && pTab->eType==FTS5_VOCAB_COL ){
    for(/* noop */; pCsr->iCol<nCol && pCsr->aDoc[pCsr->iCol]==0; pCsr->iCol++);
    if( pCsr->iCol==nCol ){
      rc = FTS5_CORRUPT;
    }
  }
  return rc;
}